

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPM2B_ATTEST_Marshal(TPM2B_ATTEST *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  
  UINT16_Marshal((UINT16 *)source,buffer,size);
  if ((source->t).size == 0) {
    UVar1 = 2;
  }
  else {
    UVar1 = BYTE_Array_Marshal((source->t).attestationData,buffer,size,(uint)(source->t).size);
    UVar1 = UVar1 + 2;
  }
  return UVar1;
}

Assistant:

UINT16
TPM2B_ATTEST_Marshal(TPM2B_ATTEST *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT16_Marshal((UINT16 *)&(source->t.size), buffer, size));
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(source->t.size == 0)
        return result;
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->t.attestationData), buffer, size, (INT32)(source->t.size)));
    return result;
}